

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O0

int_mv av1_get_ref_mv_from_stack
                 (int ref_idx,MV_REFERENCE_FRAME *ref_frame,int ref_mv_idx,
                 MB_MODE_INFO_EXT *mbmi_ext)

{
  int8_t iVar1;
  long lVar2;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  int in_EDI;
  CANDIDATE_MV *curr_ref_mv_stack;
  int8_t ref_frame_type;
  MV_REFERENCE_FRAME *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  iVar1 = av1_ref_frame_type(in_stack_ffffffffffffffc8);
  lVar2 = in_RCX + (long)iVar1 * 0x20;
  if (*(char *)(in_RSI + 1) < '\x01') {
    if (in_EDX < (int)(uint)*(byte *)(in_RCX + 0x488 + (long)iVar1)) {
      local_4 = *(int_mv *)(lVar2 + (long)in_EDX * 8);
    }
    else {
      local_4 = *(int_mv *)(in_RCX + 0x4a8 + (long)iVar1 * 4);
    }
  }
  else if (in_EDI == 0) {
    local_4 = *(int_mv *)(lVar2 + (long)in_EDX * 8);
  }
  else {
    local_4 = *(int_mv *)(lVar2 + 4 + (long)in_EDX * 8);
  }
  return (int_mv)local_4.as_int;
}

Assistant:

int_mv av1_get_ref_mv_from_stack(int ref_idx,
                                 const MV_REFERENCE_FRAME *ref_frame,
                                 int ref_mv_idx,
                                 const MB_MODE_INFO_EXT *mbmi_ext) {
  const int8_t ref_frame_type = av1_ref_frame_type(ref_frame);
  const CANDIDATE_MV *curr_ref_mv_stack =
      mbmi_ext->ref_mv_stack[ref_frame_type];

  if (ref_frame[1] > INTRA_FRAME) {
    assert(ref_idx == 0 || ref_idx == 1);
    return ref_idx ? curr_ref_mv_stack[ref_mv_idx].comp_mv
                   : curr_ref_mv_stack[ref_mv_idx].this_mv;
  }

  assert(ref_idx == 0);
  return ref_mv_idx < mbmi_ext->ref_mv_count[ref_frame_type]
             ? curr_ref_mv_stack[ref_mv_idx].this_mv
             : mbmi_ext->global_mvs[ref_frame_type];
}